

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,char *filename)

{
  double *pdVar1;
  REF_DBL RVar2;
  double dVar3;
  REF_GEOM ref_geom;
  REF_INT *pRVar4;
  REF_ADJ pRVar5;
  REF_DBL *pRVar6;
  double dVar7;
  double dVar8;
  FILE *__stream;
  uint uVar9;
  REF_STATUS RVar10;
  uint uVar11;
  ulong uVar12;
  REF_ADJ_ITEM pRVar13;
  REF_DBL *pRVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  ulong uVar18;
  REF_DBL *pRVar19;
  int iVar20;
  long lVar21;
  REF_INT RVar22;
  int iVar23;
  REF_CELL pRVar24;
  char *pcVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int cell;
  REF_GEOM pRVar29;
  ulong uStackY_170;
  REF_INT local;
  REF_INT sens;
  REF_DICT ref_dict;
  REF_CELL local_148;
  REF_DBL radius;
  REF_GEOM local_138;
  uint local_12c;
  REF_DBL tvalue;
  FILE *local_120;
  ulong local_118;
  REF_DBL *local_110;
  REF_NODE local_108;
  REF_INT sens_1;
  REF_DBL normal [3];
  REF_DBL param [2];
  REF_INT nodes [27];
  
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x4f5,"ref_facelift_tec","requires indirect facelift");
    RVar10 = 1;
  }
  else {
    pRVar29 = ref_facelift->grid->geom;
    local_120 = fopen(filename,"w");
    if (local_120 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x4f9,"ref_facelift_tec","unable to open file");
      RVar10 = 2;
    }
    else {
      fwrite("title=\"refine watertight cad displacement\"\n",0x2b,1,local_120);
      fwrite("variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n",0x33,1,
             local_120);
      uVar12 = 0;
      uVar18 = (ulong)(uint)pRVar29->max;
      if (pRVar29->max < 1) {
        uVar18 = uVar12;
      }
      uVar27 = 0x80000000;
      uVar26 = 0x7fffffff;
      for (; uVar18 * 0x18 - uVar12 != 0; uVar12 = uVar12 + 0x18) {
        if (*(int *)((long)pRVar29->descr + uVar12) == 1) {
          uVar9 = *(uint *)((long)pRVar29->descr + uVar12 + 4);
          if ((int)uVar9 <= (int)uVar26) {
            uVar26 = uVar9;
          }
          if ((int)uVar27 <= (int)uVar9) {
            uVar27 = uVar9;
          }
        }
      }
      for (; (int)uVar26 <= (int)uVar27; uVar26 = uVar26 + 1) {
        if (ref_facelift->displacement == (REF_DBL *)0x0) {
          pcVar25 = "requires indirect facelift";
          uVar17 = 0x3c7;
LAB_001e40ec:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar17,"ref_facelift_edge_tec_zone",pcVar25);
LAB_001e40f3:
          uStackY_170 = 1;
LAB_001e41c1:
          pcVar25 = "tec edge";
          uVar17 = 0x508;
          RVar10 = (REF_STATUS)uStackY_170;
          goto LAB_001e41e5;
        }
        pRVar24 = ref_facelift->edg_cell;
        local_108 = ref_facelift->grid->node;
        ref_geom = ref_facelift->grid->geom;
        uVar9 = ref_dict_create(&ref_dict);
        if (uVar9 != 0) {
          pcVar25 = "create dict";
          uVar17 = 0x3c9;
LAB_001e41b7:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar17,"ref_facelift_edge_tec_zone",(ulong)uVar9,pcVar25);
          uStackY_170 = (ulong)uVar9;
          goto LAB_001e41c1;
        }
        lVar21 = 0;
        local_148 = (REF_CELL)0xffffffffffffffff;
        for (uVar18 = 0; (long)uVar18 < (long)ref_geom->max; uVar18 = uVar18 + 1) {
          pRVar4 = ref_geom->descr;
          if ((*(int *)((long)pRVar4 + lVar21) == 1) &&
             (*(uint *)((long)pRVar4 + lVar21 + 4) == uVar26)) {
            uVar9 = ref_dict_store(ref_dict,*(REF_INT *)((long)pRVar4 + lVar21 + 0x14),
                                   (REF_INT)uVar18);
            if (uVar9 != 0) {
              pcVar25 = "mark nodes";
              uVar17 = 0x3ce;
              goto LAB_001e41b7;
            }
            if (*(int *)((long)ref_geom->descr + lVar21 + 0xc) != 0) {
              if ((int)local_148 != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x3d0,"ref_facelift_edge_tec_zone","should be only one jump per edge",
                       0xffffffffffffffff,(long)(int)local_148);
                goto LAB_001e40f3;
              }
              local_148 = (REF_CELL)(uVar18 & 0xffffffff);
            }
          }
          lVar21 = lVar21 + 0x18;
        }
        local_118 = (ulong)(uint)ref_dict->n;
        uVar18 = 0;
        for (iVar20 = 0; iVar20 < pRVar24->max; iVar20 = iVar20 + 1) {
          RVar10 = ref_cell_nodes(pRVar24,iVar20,nodes);
          uVar18 = (ulong)((int)uVar18 + (uint)(nodes[2] == uVar26 && RVar10 == 0));
        }
        uVar9 = (int)local_118 + (uint)((int)local_148 != -1);
        uVar12 = (ulong)uVar9;
        local_118 = uVar12;
        if ((uVar9 == 0) || ((int)uVar18 == 0)) {
          uVar9 = ref_dict_free(ref_dict);
          if (uVar9 != 0) {
            pcVar25 = "free dict";
            uVar17 = 0x3e1;
            goto LAB_001e41b7;
          }
        }
        else {
          fprintf(local_120,
                  "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)uVar26,uVar12,uVar18,"point","felineseg");
          if ((int)uVar9 < 0) {
            pcVar25 = "malloc t of REF_DBL negative";
            uVar17 = 0x3ea;
            goto LAB_001e40ec;
          }
          local_138 = (REF_GEOM)malloc(uVar12 * 8);
          if (local_138 == (REF_GEOM)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x3ea,"ref_facelift_edge_tec_zone","malloc t of REF_DBL NULL");
            uStackY_170 = 2;
            goto LAB_001e41c1;
          }
          local_12c = uVar9 - 1;
          for (iVar20 = 0; iVar20 < pRVar24->max; iVar20 = iVar20 + 1) {
            RVar10 = ref_cell_nodes(pRVar24,iVar20,nodes);
            if ((RVar10 == 0) && (nodes[2] == uVar26)) {
              uVar11 = ref_dict_location(ref_dict,nodes[0],&local);
              if (uVar11 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x3f1,"ref_facelift_edge_tec_zone",(ulong)uVar11,"localize");
                printf("edg %d %d id %d no edge geom\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
                       (ulong)(uint)nodes[2]);
                uVar9 = ref_node_location(local_108,nodes[0]);
                if (uVar9 == 0) {
                  uVar9 = ref_geom_tattle(ref_geom,nodes[0]);
                  uStackY_170 = (ulong)uVar11;
                  if (uVar9 == 0) goto LAB_001e41c1;
                  pcVar25 = "tatt";
                  uVar17 = 0x3f0;
                }
                else {
                  pcVar25 = "loc";
                  uVar17 = 0x3ef;
                }
                goto LAB_001e41b7;
              }
              uVar9 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
              if (uVar9 != 0) {
                pcVar25 = "from";
                uVar17 = 0x3f4;
                goto LAB_001e41b7;
              }
              if (sens == -1) {
                local = local_12c;
              }
              *(REF_DBL *)(&local_138->n + (long)local * 2) = tvalue;
              uVar9 = ref_dict_location(ref_dict,nodes[1],&local);
              if (uVar9 != 0) {
                pcVar25 = "localize";
                uVar17 = 0x3f7;
                goto LAB_001e41b7;
              }
              uVar9 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
              if (uVar9 != 0) {
                pcVar25 = "from";
                uVar17 = 0x3fa;
                goto LAB_001e41b7;
              }
              if (sens == -1) {
                local = local_12c;
              }
              *(REF_DBL *)(&local_138->n + (long)local * 2) = tvalue;
            }
          }
          iVar20 = ref_dict->n;
          RVar22 = -1;
          iVar28 = -1;
          if (0 < iVar20) {
            iVar28 = *ref_dict->key;
            RVar22 = *ref_dict->value;
          }
          local_110 = (REF_DBL *)0x0;
          for (lVar21 = 0; lVar21 < iVar20; lVar21 = lVar21 + 1) {
            radius = 0.0;
            pRVar14 = local_108->real;
            lVar15 = (long)(iVar28 * 0xf);
            param[0] = pRVar14[lVar15];
            param[1] = pRVar14[lVar15 + 1];
            RVar2 = pRVar14[lVar15 + 2];
            if (ref_geom->model != (void *)0x0) {
              uVar9 = ref_egads_edge_curvature(ref_geom,RVar22,&radius,normal);
              if (uVar9 != 0) {
                pcVar25 = "curve";
                uVar17 = 0x406;
                goto LAB_001e41b7;
              }
              if (radius <= -radius) {
                radius = -radius;
              }
              uVar9 = ref_egads_eval_at(ref_geom,1,uVar26,
                                        (REF_DBL *)((long)&local_138->n + (long)local_110),param,
                                        (REF_DBL *)0x0);
              if (uVar9 != 0) {
                pcVar25 = "eval at";
                uVar17 = 0x409;
                goto LAB_001e41b7;
              }
            }
            dVar3 = ref_facelift->displacement[RVar22 * 3];
            pdVar1 = ref_facelift->displacement + (long)(RVar22 * 3) + 1;
            dVar7 = *pdVar1;
            dVar8 = pdVar1[1];
            fprintf(local_120," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",param[0],
                    param[1],RVar2,SQRT(dVar8 * dVar8 + dVar3 * dVar3 + dVar7 * dVar7),
                    *(undefined8 *)(&local_138->n + lVar21 * 2),0);
            iVar20 = ref_dict->n;
            iVar28 = -1;
            RVar22 = -1;
            if ((int)lVar21 + 1 < iVar20) {
              iVar28 = ref_dict->key[lVar21 + 1];
              RVar22 = ref_dict->value[lVar21 + 1];
            }
            local_110 = local_110 + 1;
          }
          iVar20 = (int)local_148;
          if (iVar20 != -1) {
            lVar21 = (long)ref_geom->descr[(long)(iVar20 * 6) + 5];
            radius = 0.0;
            pRVar14 = local_108->real;
            param[0] = pRVar14[lVar21 * 0xf];
            param[1] = pRVar14[lVar21 * 0xf + 1];
            RVar2 = pRVar14[lVar21 * 0xf + 2];
            if (ref_geom->model != (void *)0x0) {
              uVar9 = ref_egads_edge_curvature(ref_geom,iVar20,&radius,normal);
              if (uVar9 == 0) {
                if (radius <= -radius) {
                  radius = -radius;
                }
                uVar9 = ref_egads_eval_at(ref_geom,1,uVar26,
                                          (REF_DBL *)((long)local_138 + uVar12 * 8 + -8),param,
                                          (REF_DBL *)0x0);
                if (uVar9 == 0) {
                  iVar20 = (int)local_148;
                  goto LAB_001e3185;
                }
                pcVar25 = "eval at";
                uVar17 = 0x41d;
              }
              else {
                pcVar25 = "curve";
                uVar17 = 0x419;
              }
              goto LAB_001e41b7;
            }
LAB_001e3185:
            dVar3 = ref_facelift->displacement[iVar20 * 3];
            pdVar1 = ref_facelift->displacement + (long)(iVar20 * 3) + 1;
            dVar7 = *pdVar1;
            dVar8 = pdVar1[1];
            fprintf(local_120," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",param[0],
                    param[1],RVar2,SQRT(dVar8 * dVar8 + dVar3 * dVar3 + dVar7 * dVar7),
                    *(undefined8 *)((long)local_138 + uVar12 * 8 + -8),0);
          }
          free(local_138);
          for (iVar20 = 0; iVar20 < pRVar24->max; iVar20 = iVar20 + 1) {
            RVar10 = ref_cell_nodes(pRVar24,iVar20,nodes);
            if ((RVar10 == 0) && (nodes[2] == uVar26)) {
              uVar9 = ref_dict_location(ref_dict,nodes[0],&local);
              if (uVar9 != 0) {
                pcVar25 = "localize";
                uVar17 = 0x42b;
                goto LAB_001e41b7;
              }
              uVar9 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
              if (uVar9 != 0) {
                pcVar25 = "from";
                uVar17 = 0x42e;
                goto LAB_001e41b7;
              }
              if (sens == -1) {
                local = local_12c;
                uVar18 = local_118 & 0xffffffff;
              }
              else {
                uVar18 = (ulong)(local + 1);
              }
              fprintf(local_120," %d",uVar18);
              uVar9 = ref_dict_location(ref_dict,nodes[1],&local);
              if (uVar9 != 0) {
                pcVar25 = "localize";
                uVar17 = 0x431;
                goto LAB_001e41b7;
              }
              uVar9 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
              __stream = local_120;
              if (uVar9 != 0) {
                pcVar25 = "from";
                uVar17 = 0x434;
                goto LAB_001e41b7;
              }
              if (sens == -1) {
                local = local_12c;
                uVar18 = local_118 & 0xffffffff;
              }
              else {
                uVar18 = (ulong)(local + 1);
              }
              fprintf(local_120," %d",uVar18);
              fputc(10,__stream);
            }
          }
          uVar9 = ref_dict_free(ref_dict);
          if (uVar9 != 0) {
            pcVar25 = "free dict";
            uVar17 = 0x43b;
            goto LAB_001e41b7;
          }
        }
      }
      uVar12 = 0;
      uVar18 = (ulong)(uint)pRVar29->max;
      if (pRVar29->max < 1) {
        uVar18 = uVar12;
      }
      uVar26 = 0x80000000;
      uVar27 = 0x7fffffff;
      for (; uVar18 * 0x18 - uVar12 != 0; uVar12 = uVar12 + 0x18) {
        if (*(int *)((long)pRVar29->descr + uVar12) == 2) {
          uVar9 = *(uint *)((long)pRVar29->descr + uVar12 + 4);
          if ((int)uVar9 <= (int)uVar27) {
            uVar27 = uVar9;
          }
          if ((int)uVar26 <= (int)uVar9) {
            uVar26 = uVar9;
          }
        }
      }
      for (; (int)uVar27 <= (int)uVar26; uVar27 = uVar27 + 1) {
        if (ref_facelift->displacement == (REF_DBL *)0x0) {
          pcVar25 = "requires indirect facelift";
          uVar17 = 0x44e;
LAB_001e42a9:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar17,"ref_facelift_face_tec_zone",pcVar25);
          uStackY_170 = 1;
          goto LAB_001e4561;
        }
        local_148 = ref_facelift->tri_cell;
        local_108 = ref_facelift->grid->node;
        local_138 = ref_facelift->grid->geom;
        uVar9 = ref_dict_create(&ref_dict);
        if (uVar9 != 0) {
          uStackY_170 = (ulong)uVar9;
          pcVar25 = "create dict";
          uVar17 = 0x450;
LAB_001e4557:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar17,"ref_facelift_face_tec_zone",uStackY_170,pcVar25);
LAB_001e4561:
          RVar10 = (REF_STATUS)uStackY_170;
          pcVar25 = "tec face";
          uVar17 = 0x512;
LAB_001e41e5:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar17,"ref_facelift_tec",uStackY_170,pcVar25);
          return RVar10;
        }
        uVar9 = ref_dict_create((REF_DICT *)&tvalue);
        if (uVar9 != 0) {
          uStackY_170 = (ulong)uVar9;
          pcVar25 = "create dict";
          uVar17 = 0x451;
          goto LAB_001e4557;
        }
        uVar9 = ref_dict_create((REF_DICT *)&radius);
        if (uVar9 != 0) {
          uStackY_170 = (ulong)uVar9;
          pcVar25 = "create dict";
          uVar17 = 0x452;
          goto LAB_001e4557;
        }
        pRVar24 = local_148;
        local_12c = uVar26;
        for (local = 0; local < local_138->max; local = local + 1) {
          pRVar4 = local_138->descr;
          uVar26 = local * 6;
          if ((pRVar4[(int)uVar26] == 2) && (pRVar4[(int)(uVar26 | 1)] == uVar27)) {
            uVar9 = pRVar4[(long)(int)uVar26 + 5];
            if (pRVar4[(long)(int)uVar26 + 4] != 0) {
              RVar22 = -1;
              iVar20 = -1;
              if ((int)uVar9 < 0) goto LAB_001e36c3;
              pRVar5 = pRVar24->ref_adj;
              if (pRVar5->nnode <= (int)uVar9) goto LAB_001e36c3;
              iVar28 = pRVar5->first[uVar9];
              if (iVar28 == -1) goto LAB_001e36c3;
              pRVar13 = pRVar5->item;
              do {
                RVar22 = pRVar13[iVar28].ref;
                iVar20 = iVar28;
LAB_001e36c3:
                do {
                  if (iVar20 == -1) goto LAB_001e36b3;
                  uVar26 = ref_cell_nodes(pRVar24,RVar22,nodes);
                  if (uVar26 != 0) {
                    pcVar25 = "nodes";
                    uVar17 = 0x45e;
                    goto LAB_001e4093;
                  }
                  if ((nodes[3] == uVar27) &&
                     (uVar26 = ref_dict_store((REF_DICT)radius,RVar22,uVar9), uVar26 != 0)) {
                    pcVar25 = "mark degen";
                    uVar17 = 0x460;
                    goto LAB_001e4224;
                  }
                  pRVar13 = local_148->ref_adj->item;
                  iVar28 = pRVar13[iVar20].next;
                  RVar22 = -1;
                  pRVar24 = local_148;
                  iVar20 = iVar28;
                } while (iVar28 == -1);
              } while( true );
            }
            uVar26 = ref_dict_store(ref_dict,uVar9,local);
            if (uVar26 != 0) {
              pcVar25 = "mark nodes";
              uVar17 = 0x458;
              goto LAB_001e4224;
            }
            pRVar24 = local_148;
            if ((local_138->descr[(long)local * 6 + 3] != 0) &&
               (uVar26 = ref_dict_store((REF_DICT)tvalue,uVar9,local), pRVar24 = local_148,
               uVar26 != 0)) {
              uStackY_170 = (ulong)uVar26;
              pcVar25 = "mark jump";
              uVar17 = 0x45a;
              goto LAB_001e4557;
            }
          }
LAB_001e36b3:
        }
        iVar20 = ref_dict->n;
        iVar28 = *(int *)tvalue;
        iVar23 = *(int *)radius;
        uVar18 = 0;
        for (cell = 0; cell < pRVar24->max; cell = cell + 1) {
          RVar10 = ref_cell_nodes(local_148,cell,nodes);
          uVar18 = (ulong)((int)uVar18 + (uint)(nodes[3] == uVar27 && RVar10 == 0));
          pRVar24 = local_148;
        }
        lVar21 = (long)iVar28 + (long)iVar20;
        iVar28 = (int)lVar21;
        uVar26 = iVar23 + iVar28;
        if ((uVar26 != 0) && ((int)uVar18 != 0)) {
          fprintf(local_120,
                  "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)uVar27,(ulong)uVar26,uVar18,"point","fetriangle");
          if ((int)uVar26 < 0) {
            pcVar25 = "malloc uv of REF_DBL negative";
            uVar17 = 0x480;
            goto LAB_001e42a9;
          }
          uVar26 = uVar26 * 2;
          pRVar14 = (REF_DBL *)malloc((ulong)uVar26 << 3);
          if (pRVar14 == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x480,"ref_facelift_face_tec_zone","malloc uv of REF_DBL NULL");
            uStackY_170 = 2;
            goto LAB_001e4561;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          for (uVar18 = 0; uVar26 != uVar18; uVar18 = uVar18 + 1) {
            pRVar14[uVar18] = -1.0;
          }
          iVar23 = 0;
          local_110 = pRVar14;
          while (iVar23 < local_148->max) {
            local_118 = CONCAT44(local_118._4_4_,iVar23);
            RVar10 = ref_cell_nodes(local_148,iVar23,nodes);
            if ((RVar10 == 0) && (nodes[3] == uVar27)) {
              for (lVar15 = 0; pRVar29 = local_138, lVar15 < local_148->node_per;
                  lVar15 = lVar15 + 1) {
                uVar26 = ref_geom_find(local_138,nodes[lVar15],2,uVar27,&local);
                if (uVar26 != 0) {
                  pcVar25 = "find";
                  uVar17 = 0x485;
                  goto LAB_001e4093;
                }
                uVar26 = ref_geom_cell_tuv(pRVar29,nodes[lVar15],nodes,2,param,&sens_1);
                if (uVar26 != 0) {
                  pcVar25 = "cell tuv";
                  uVar17 = 0x488;
                  goto LAB_001e4093;
                }
                if (pRVar29->descr[(long)local * 6 + 4] == 0) {
                  if ((uint)sens_1 < 2) {
                    uVar26 = ref_dict_location(ref_dict,nodes[lVar15],&sens);
                    if (uVar26 != 0) {
                      pcVar25 = "localize";
                      uVar17 = 0x48b;
                      goto LAB_001e4093;
                    }
                  }
                  else {
                    uVar26 = ref_dict_location((REF_DICT)tvalue,nodes[lVar15],&sens);
                    if (uVar26 != 0) {
                      pcVar25 = "localize";
                      uVar17 = 0x48e;
                      goto LAB_001e4093;
                    }
                    sens = sens + iVar20;
                  }
                }
                else {
                  uVar26 = ref_dict_location((REF_DICT)radius,(REF_INT)local_118,&sens);
                  if (uVar26 != 0) {
                    pcVar25 = "localize";
                    uVar17 = 0x492;
                    goto LAB_001e4093;
                  }
                  sens = sens + iVar28;
                }
                local_110[sens * 2] = param[0];
                (local_110 + sens * 2)[1] = param[1];
                pRVar14 = local_110;
              }
            }
            iVar23 = (REF_INT)local_118 + 1;
          }
          local = -1;
          iVar23 = -1;
          if (0 < ref_dict->n) {
            iVar23 = *ref_dict->key;
            local = *ref_dict->value;
          }
          pRVar19 = pRVar14;
          pRVar29 = local_138;
          for (lVar15 = 1; lVar15 + -1 < (long)ref_dict->n; lVar15 = lVar15 + 1) {
            pRVar6 = local_108->real;
            lVar16 = (long)(iVar23 * 0xf);
            normal[0] = pRVar6[lVar16];
            normal[1] = pRVar6[lVar16 + 1];
            normal[2] = pRVar6[lVar16 + 2];
            if ((pRVar29->model != (void *)0x0) &&
               (uVar26 = ref_egads_eval_at(pRVar29,2,uVar27,pRVar19,normal,(REF_DBL *)0x0),
               pRVar29 = local_138, uVar26 != 0)) {
              uStackY_170 = (ulong)uVar26;
              pcVar25 = "eval at";
              uVar17 = 0x4a2;
              goto LAB_001e4557;
            }
            dVar3 = ref_facelift->displacement[local * 3];
            pdVar1 = ref_facelift->displacement + (long)(local * 3) + 1;
            dVar7 = *pdVar1;
            dVar8 = pdVar1[1];
            fprintf(local_120," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",normal[0],
                    normal[1],normal[2],SQRT(dVar8 * dVar8 + dVar3 * dVar3 + dVar7 * dVar7),*pRVar19
                    ,pRVar19[1]);
            iVar23 = -1;
            local = -1;
            if ((int)lVar15 < ref_dict->n) {
              iVar23 = ref_dict->key[lVar15];
              local = ref_dict->value[lVar15];
            }
            pRVar19 = pRVar19 + 2;
          }
          local = -1;
          iVar23 = -1;
          if (0 < *(int *)tvalue) {
            iVar23 = **(int **)((long)tvalue + 0x10);
            local = **(REF_INT **)((long)tvalue + 0x18);
          }
          pRVar14 = pRVar14 + (long)iVar20 * 2;
          for (lVar15 = 1; lVar15 + -1 < (long)*(int *)tvalue; lVar15 = lVar15 + 1) {
            pRVar19 = local_108->real;
            lVar16 = (long)(iVar23 * 0xf);
            normal[0] = pRVar19[lVar16];
            normal[1] = pRVar19[lVar16 + 1];
            normal[2] = pRVar19[lVar16 + 2];
            if ((pRVar29->model != (void *)0x0) &&
               (uVar26 = ref_egads_eval_at(pRVar29,2,uVar27,pRVar14,normal,(REF_DBL *)0x0),
               pRVar29 = local_138, uVar26 != 0)) {
              uStackY_170 = (ulong)uVar26;
              pcVar25 = "eval at";
              uVar17 = 0x4b2;
              goto LAB_001e4557;
            }
            dVar3 = ref_facelift->displacement[local * 3];
            pdVar1 = ref_facelift->displacement + (long)(local * 3) + 1;
            dVar7 = *pdVar1;
            dVar8 = pdVar1[1];
            fprintf(local_120," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",normal[0],
                    normal[1],normal[2],SQRT(dVar8 * dVar8 + dVar3 * dVar3 + dVar7 * dVar7),*pRVar14
                    ,pRVar14[1]);
            iVar23 = -1;
            local = -1;
            if (lVar15 < *(int *)tvalue) {
              iVar23 = *(int *)(*(long *)((long)tvalue + 0x10) + lVar15 * 4);
              local = *(REF_INT *)(*(long *)((long)tvalue + 0x18) + lVar15 * 4);
            }
            pRVar14 = pRVar14 + 2;
          }
          uVar18 = (ulong)*(uint *)radius;
          RVar22 = -1;
          if (0 < (int)*(uint *)radius) {
            RVar22 = **(REF_INT **)((long)radius + 0x18);
          }
          pRVar14 = local_110 + lVar21 * 2;
          for (lVar21 = 1; lVar21 + -1 < (long)(int)uVar18; lVar21 = lVar21 + 1) {
            uVar26 = ref_geom_find(pRVar29,RVar22,2,uVar27,&local);
            if (uVar26 != 0) {
              pcVar25 = "find";
              uVar17 = 0x4bc;
LAB_001e4093:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,uVar17,"ref_facelift_face_tec_zone",(ulong)uVar26,pcVar25);
              uStackY_170 = (ulong)uVar26;
              goto LAB_001e4561;
            }
            pRVar19 = local_108->real;
            lVar15 = (long)(RVar22 * 0xf);
            normal[0] = pRVar19[lVar15];
            normal[1] = pRVar19[lVar15 + 1];
            normal[2] = pRVar19[lVar15 + 2];
            if ((pRVar29->model != (void *)0x0) &&
               (uVar26 = ref_egads_eval_at(pRVar29,2,uVar27,pRVar14,normal,(REF_DBL *)0x0),
               uVar26 != 0)) {
              pcVar25 = "eval at";
              uVar17 = 0x4c3;
LAB_001e4224:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,uVar17,"ref_facelift_face_tec_zone",(ulong)uVar26,pcVar25);
              uStackY_170 = (ulong)uVar26;
              goto LAB_001e4561;
            }
            dVar3 = ref_facelift->displacement[(long)local * 3];
            pdVar1 = ref_facelift->displacement + (long)local * 3 + 1;
            dVar7 = *pdVar1;
            dVar8 = pdVar1[1];
            fprintf(local_120," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",normal[0],
                    normal[1],normal[2],SQRT(dVar8 * dVar8 + dVar3 * dVar3 + dVar7 * dVar7),*pRVar14
                    ,pRVar14[1]);
            uVar18 = (ulong)*(int *)radius;
            RVar22 = -1;
            if (lVar21 < (long)uVar18) {
              RVar22 = *(REF_INT *)(*(long *)((long)radius + 0x18) + lVar21 * 4);
            }
            pRVar14 = pRVar14 + 2;
          }
          free(local_110);
          for (iVar23 = 0; iVar23 < local_148->max; iVar23 = iVar23 + 1) {
            RVar10 = ref_cell_nodes(local_148,iVar23,nodes);
            if ((RVar10 == 0) && (nodes[3] == uVar27)) {
              for (lVar21 = 0; pRVar29 = local_138, lVar21 < local_148->node_per;
                  lVar21 = lVar21 + 1) {
                uVar26 = ref_geom_find(local_138,nodes[lVar21],2,uVar27,&local);
                if (uVar26 != 0) {
                  pcVar25 = "find";
                  uVar17 = 0x4d2;
                  goto LAB_001e4224;
                }
                uVar26 = ref_geom_cell_tuv(pRVar29,nodes[lVar21],nodes,2,param,&sens_1);
                if (uVar26 != 0) {
                  pcVar25 = "cell tuv";
                  uVar17 = 0x4d5;
                  goto LAB_001e4224;
                }
                if (pRVar29->descr[(long)local * 6 + 4] == 0) {
                  if ((uint)sens_1 < 2) {
                    uVar26 = ref_dict_location(ref_dict,nodes[lVar21],&sens);
                    if (uVar26 != 0) {
                      pcVar25 = "localize";
                      uVar17 = 0x4d8;
                      goto LAB_001e4224;
                    }
                  }
                  else {
                    uVar26 = ref_dict_location((REF_DICT)tvalue,nodes[lVar21],&sens);
                    if (uVar26 != 0) {
                      pcVar25 = "localize";
                      uVar17 = 0x4db;
                      goto LAB_001e4224;
                    }
                    sens = sens + iVar20;
                  }
                }
                else {
                  uVar26 = ref_dict_location((REF_DICT)radius,iVar23,&sens);
                  if (uVar26 != 0) {
                    pcVar25 = "localize";
                    uVar17 = 0x4df;
                    goto LAB_001e4224;
                  }
                  sens = sens + iVar28;
                }
                fprintf(local_120," %d",(ulong)(sens + 1));
              }
              fputc(10,local_120);
            }
          }
          uVar26 = ref_dict_free((REF_DICT)radius);
          if (uVar26 == 0) {
            uVar26 = ref_dict_free((REF_DICT)tvalue);
            if (uVar26 == 0) {
              uVar9 = ref_dict_free(ref_dict);
              uVar26 = local_12c;
              if (uVar9 == 0) goto LAB_001e385c;
              uStackY_170 = (ulong)uVar9;
              pcVar25 = "free dict";
              uVar17 = 0x4ea;
            }
            else {
              uStackY_170 = (ulong)uVar26;
              pcVar25 = "free jump";
              uVar17 = 0x4e9;
            }
          }
          else {
            uStackY_170 = (ulong)uVar26;
            pcVar25 = "free degen";
            uVar17 = 0x4e8;
          }
          goto LAB_001e4557;
        }
        uVar26 = ref_dict_free((REF_DICT)radius);
        if (uVar26 != 0) {
          uStackY_170 = (ulong)uVar26;
          pcVar25 = "free degen";
          uVar17 = 0x475;
          goto LAB_001e4557;
        }
        uVar9 = ref_dict_free((REF_DICT)tvalue);
        uVar26 = local_12c;
        if (uVar9 != 0) {
          uStackY_170 = (ulong)uVar9;
          pcVar25 = "free jump";
          uVar17 = 0x476;
          goto LAB_001e4557;
        }
        uVar9 = ref_dict_free(ref_dict);
        if (uVar9 != 0) {
          uStackY_170 = (ulong)uVar9;
          pcVar25 = "free dict";
          uVar17 = 0x477;
          goto LAB_001e4557;
        }
LAB_001e385c:
      }
      fclose(local_120);
      RVar10 = 0;
    }
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,
                                    const char *filename) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine watertight cad displacement\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_edge_tec_zone(ref_facelift, id, file), "tec edge");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_face_tec_zone(ref_facelift, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}